

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

ostream * despot::operator<<(ostream *os,
                            vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            *vec)

{
  ostream *os_00;
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  vector<despot::State,_std::allocator<despot::State>_> vStack_48;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)(vec->
                             super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar1 = uVar1 + 1)
  {
    pcVar2 = ", ";
    if (lVar3 == 0) {
      pcVar2 = "";
    }
    os_00 = std::operator<<(os,pcVar2);
    std::vector<despot::State,_std::allocator<despot::State>_>::vector
              (&vStack_48,
               (vector<despot::State,_std::allocator<despot::State>_> *)
               ((long)&(((vec->
                         super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<despot::State,_std::allocator<despot::State>_>)._M_impl.
                       super__Vector_impl_data + lVar3));
    operator<<(os_00,&vStack_48);
    std::vector<despot::State,_std::allocator<despot::State>_>::~vector(&vStack_48);
    lVar3 = lVar3 + 0x18;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}